

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avrogencpp.cc
# Opt level: O0

void __thiscall CodeGen::generateRecordTraits(CodeGen *this,NodePtr *n)

{
  int iVar1;
  type pNVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  shared_ptr<avro::Node> *in_RSI;
  long in_RDI;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  string fn;
  size_t i;
  size_t c;
  Name *in_stack_fffffffffffffed8;
  CodeGen *in_stack_fffffffffffffee0;
  string *in_stack_ffffffffffffff20;
  CodeGen *in_stack_ffffffffffffff28;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  string local_60 [32];
  string local_40 [32];
  ulong local_20;
  ulong local_18;
  shared_ptr<avro::Node> *local_10;
  
  local_10 = in_RSI;
  pNVar2 = boost::shared_ptr<avro::Node>::operator->(in_RSI);
  iVar1 = (*pNVar2->_vptr_Node[4])();
  local_18 = CONCAT44(extraout_var,iVar1);
  for (local_20 = 0; local_20 < local_18; local_20 = local_20 + 1) {
    pNVar2 = boost::shared_ptr<avro::Node>::operator->(local_10);
    (*pNVar2->_vptr_Node[5])(pNVar2,local_20 & 0xffffffff);
    generateTraits(in_stack_fffffffffffffee0,(NodePtr *)in_stack_fffffffffffffed8);
  }
  pNVar2 = boost::shared_ptr<avro::Node>::operator->(local_10);
  (*pNVar2->_vptr_Node[3])();
  decorate_abi_cxx11_(in_stack_fffffffffffffed8);
  fullname(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::__cxx11::string::~string(local_60);
  poVar3 = std::operator<<(*(ostream **)(in_RDI + 8),"template<> struct codec_traits<");
  poVar3 = std::operator<<(poVar3,local_40);
  poVar3 = std::operator<<(poVar3,"> {\n");
  poVar3 = std::operator<<(poVar3,"    static void encode(Encoder& e, const ");
  poVar3 = std::operator<<(poVar3,local_40);
  std::operator<<(poVar3,"& v) {\n");
  for (local_78 = 0; local_78 < local_18; local_78 = local_78 + 1) {
    poVar3 = std::operator<<(*(ostream **)(in_RDI + 8),"        avro::encode(e, v.");
    pNVar2 = boost::shared_ptr<avro::Node>::operator->(local_10);
    iVar1 = (*pNVar2->_vptr_Node[8])(pNVar2,local_78 & 0xffffffff);
    poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_00,iVar1));
    std::operator<<(poVar3,");\n");
  }
  poVar3 = std::operator<<(*(ostream **)(in_RDI + 8),"    }\n");
  poVar3 = std::operator<<(poVar3,"    static void decode(Decoder& d, ");
  poVar3 = std::operator<<(poVar3,local_40);
  std::operator<<(poVar3,"& v) {\n");
  std::operator<<(*(ostream **)(in_RDI + 8),"        if (avro::ResolvingDecoder *rd =\n");
  std::operator<<(*(ostream **)(in_RDI + 8),
                  "            dynamic_cast<avro::ResolvingDecoder *>(&d)) {\n");
  std::operator<<(*(ostream **)(in_RDI + 8),
                  "            const std::vector<size_t> fo = rd->fieldOrder();\n");
  std::operator<<(*(ostream **)(in_RDI + 8),
                  "            for (std::vector<size_t>::const_iterator it = fo.begin();\n");
  std::operator<<(*(ostream **)(in_RDI + 8),"                it != fo.end(); ++it) {\n");
  std::operator<<(*(ostream **)(in_RDI + 8),"                switch (*it) {\n");
  for (local_80 = 0; local_80 < local_18; local_80 = local_80 + 1) {
    poVar3 = std::operator<<(*(ostream **)(in_RDI + 8),"                case ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_80);
    std::operator<<(poVar3,":\n");
    poVar3 = std::operator<<(*(ostream **)(in_RDI + 8),"                    avro::decode(d, v.");
    pNVar2 = boost::shared_ptr<avro::Node>::operator->(local_10);
    iVar1 = (*pNVar2->_vptr_Node[8])(pNVar2,local_80 & 0xffffffff);
    poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_01,iVar1));
    std::operator<<(poVar3,");\n");
    std::operator<<(*(ostream **)(in_RDI + 8),"                    break;\n");
  }
  std::operator<<(*(ostream **)(in_RDI + 8),"                default:\n");
  std::operator<<(*(ostream **)(in_RDI + 8),"                    break;\n");
  std::operator<<(*(ostream **)(in_RDI + 8),"                }\n");
  std::operator<<(*(ostream **)(in_RDI + 8),"            }\n");
  std::operator<<(*(ostream **)(in_RDI + 8),"        } else {\n");
  for (local_88 = 0; local_88 < local_18; local_88 = local_88 + 1) {
    poVar3 = std::operator<<(*(ostream **)(in_RDI + 8),"            avro::decode(d, v.");
    pNVar2 = boost::shared_ptr<avro::Node>::operator->(local_10);
    iVar1 = (*pNVar2->_vptr_Node[8])(pNVar2,local_88 & 0xffffffff);
    poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_02,iVar1));
    std::operator<<(poVar3,");\n");
  }
  std::operator<<(*(ostream **)(in_RDI + 8),"        }\n");
  poVar3 = std::operator<<(*(ostream **)(in_RDI + 8),"    }\n");
  std::operator<<(poVar3,"};\n\n");
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void CodeGen::generateRecordTraits(const NodePtr& n)
{
    size_t c = n->leaves();
    for (size_t i = 0; i < c; ++i) {
        generateTraits(n->leafAt(i));
    }

    string fn = fullname(decorate(n->name()));
    os_ << "template<> struct codec_traits<" << fn << "> {\n"
        << "    static void encode(Encoder& e, const " << fn << "& v) {\n";

    for (size_t i = 0; i < c; ++i) {
        os_ << "        avro::encode(e, v." << n->nameAt(i) << ");\n";
    }

    os_ << "    }\n"
        << "    static void decode(Decoder& d, " << fn << "& v) {\n";
    os_ << "        if (avro::ResolvingDecoder *rd =\n";
    os_ << "            dynamic_cast<avro::ResolvingDecoder *>(&d)) {\n";
    os_ << "            const std::vector<size_t> fo = rd->fieldOrder();\n";
    os_ << "            for (std::vector<size_t>::const_iterator it = fo.begin();\n";
    os_ << "                it != fo.end(); ++it) {\n";
    os_ << "                switch (*it) {\n";
    for (size_t i = 0; i < c; ++i) {
        os_ << "                case " << i << ":\n";
        os_ << "                    avro::decode(d, v." << n->nameAt(i) << ");\n";
        os_ << "                    break;\n";
    }
    os_ << "                default:\n";
    os_ << "                    break;\n";
    os_ << "                }\n";
    os_ << "            }\n";
    os_ << "        } else {\n";

    for (size_t i = 0; i < c; ++i) {
        os_ << "            avro::decode(d, v." << n->nameAt(i) << ");\n";
    }
    os_ << "        }\n";

    os_ << "    }\n"
        << "};\n\n";
}